

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::ObjectIntersectorK<4,_false>_>,_false>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  float fVar1;
  ulong *puVar4;
  ulong *puVar5;
  ulong *puVar6;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  ulong uVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  _func_int **pp_Var21;
  ulong *puVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  byte bVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined4 uVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar66 [64];
  float fVar67;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar68 [16];
  vint4 ai;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  vint4 ai_1;
  undefined1 auVar76 [16];
  vint4 ai_3;
  undefined1 auVar77 [16];
  vint4 bi;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  vint4 bi_1;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  vint4 bi_3;
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  vint4 ai_2;
  undefined1 auVar85 [32];
  vint4 bi_2;
  int in_XMM10_Da;
  int in_XMM10_Db;
  int in_XMM10_Dc;
  int in_XMM10_Dd;
  undefined1 auVar86 [64];
  int in_XMM11_Da;
  int in_XMM11_Db;
  int in_XMM11_Dc;
  int in_XMM11_Dd;
  undefined1 auVar87 [64];
  int in_XMM12_Da;
  int in_XMM12_Db;
  int in_XMM12_Dc;
  int in_XMM12_Dd;
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  vint<4> mask;
  vint<4> octant;
  vfloat<8> fmin;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_26e0 [16];
  undefined1 local_26d0 [16];
  AccelData *local_26b8;
  ulong local_26b0;
  RayHitK<4> *local_26a8;
  RayQueryContext *local_26a0;
  long local_2698;
  long local_2690;
  long local_2688;
  long local_2680;
  long local_2678;
  uint local_2670 [4];
  RTCIntersectFunctionNArguments local_2660;
  Geometry *local_2630;
  undefined8 local_2628;
  RTCIntersectArguments *local_2620;
  undefined1 local_2610 [16];
  undefined1 local_2600 [16];
  float local_25f0;
  float fStack_25ec;
  float fStack_25e8;
  float fStack_25e4;
  float local_25e0;
  float fStack_25dc;
  float fStack_25d8;
  float fStack_25d4;
  float local_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float fStack_25c4;
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined1 local_2560 [16];
  undefined1 local_2550 [16];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  float fVar2;
  float fVar3;
  undefined1 auVar36 [16];
  undefined1 auVar33 [16];
  undefined1 auVar69 [64];
  
  auVar40 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  local_26b0 = vpcmpeqd_avx512vl(auVar40,(undefined1  [16])valid_i->field_0);
  local_26b0 = local_26b0 & 0xf;
  if ((byte)local_26b0 != 0) {
    local_26b8 = This->ptr;
    auVar39 = *(undefined1 (*) [16])(ray + 0x40);
    auVar37._8_4_ = 0x7fffffff;
    auVar37._0_8_ = 0x7fffffff7fffffff;
    auVar37._12_4_ = 0x7fffffff;
    auVar32 = vandps_avx(auVar39,auVar37);
    auVar78._8_4_ = 0x219392ef;
    auVar78._0_8_ = 0x219392ef219392ef;
    auVar78._12_4_ = 0x219392ef;
    uVar27 = vcmpps_avx512vl(auVar32,auVar78,1);
    auVar32 = vblendmps_avx512vl(auVar39,auVar78);
    bVar8 = (bool)((byte)uVar27 & 1);
    auVar38._0_4_ = (uint)bVar8 * auVar32._0_4_ | (uint)!bVar8 * in_XMM10_Da;
    bVar8 = (bool)((byte)(uVar27 >> 1) & 1);
    auVar38._4_4_ = (uint)bVar8 * auVar32._4_4_ | (uint)!bVar8 * in_XMM10_Db;
    bVar8 = (bool)((byte)(uVar27 >> 2) & 1);
    auVar38._8_4_ = (uint)bVar8 * auVar32._8_4_ | (uint)!bVar8 * in_XMM10_Dc;
    bVar8 = (bool)((byte)(uVar27 >> 3) & 1);
    auVar38._12_4_ = (uint)bVar8 * auVar32._12_4_ | (uint)!bVar8 * in_XMM10_Dd;
    auVar32 = *(undefined1 (*) [16])(ray + 0x50);
    auVar33 = vandps_avx(auVar32,auVar37);
    uVar27 = vcmpps_avx512vl(auVar33,auVar78,1);
    auVar33 = vblendmps_avx512vl(auVar32,auVar78);
    bVar8 = (bool)((byte)uVar27 & 1);
    auVar34._0_4_ = (uint)bVar8 * auVar33._0_4_ | (uint)!bVar8 * in_XMM11_Da;
    bVar8 = (bool)((byte)(uVar27 >> 1) & 1);
    auVar34._4_4_ = (uint)bVar8 * auVar33._4_4_ | (uint)!bVar8 * in_XMM11_Db;
    bVar8 = (bool)((byte)(uVar27 >> 2) & 1);
    auVar34._8_4_ = (uint)bVar8 * auVar33._8_4_ | (uint)!bVar8 * in_XMM11_Dc;
    bVar8 = (bool)((byte)(uVar27 >> 3) & 1);
    auVar34._12_4_ = (uint)bVar8 * auVar33._12_4_ | (uint)!bVar8 * in_XMM11_Dd;
    auVar33 = *(undefined1 (*) [16])(ray + 0x60);
    auVar35 = vandps_avx(auVar33,auVar37);
    uVar27 = vcmpps_avx512vl(auVar35,auVar78,1);
    auVar35 = vblendmps_avx512vl(auVar33,auVar78);
    bVar8 = (bool)((byte)uVar27 & 1);
    auVar36._0_4_ = (uint)bVar8 * auVar35._0_4_ | (uint)!bVar8 * in_XMM12_Da;
    bVar8 = (bool)((byte)(uVar27 >> 1) & 1);
    auVar36._4_4_ = (uint)bVar8 * auVar35._4_4_ | (uint)!bVar8 * in_XMM12_Db;
    bVar8 = (bool)((byte)(uVar27 >> 2) & 1);
    auVar36._8_4_ = (uint)bVar8 * auVar35._8_4_ | (uint)!bVar8 * in_XMM12_Dc;
    bVar8 = (bool)((byte)(uVar27 >> 3) & 1);
    auVar36._12_4_ = (uint)bVar8 * auVar35._12_4_ | (uint)!bVar8 * in_XMM12_Dd;
    auVar37 = vrcp14ps_avx512vl(auVar38);
    auVar78 = ZEXT816(0) << 0x40;
    auVar79._8_4_ = 0x3f800000;
    auVar79._0_8_ = 0x3f8000003f800000;
    auVar79._12_4_ = 0x3f800000;
    auVar35 = vfnmadd213ps_fma(auVar38,auVar37,auVar79);
    local_2570 = vfmadd132ps_fma(auVar35,auVar37,auVar37);
    auVar86 = ZEXT1664(local_2570);
    auVar38 = vrcp14ps_avx512vl(auVar34);
    auVar35 = vfnmadd213ps_fma(auVar34,auVar38,auVar79);
    local_2580 = vfmadd132ps_fma(auVar35,auVar38,auVar38);
    auVar87 = ZEXT1664(local_2580);
    auVar38 = vrcp14ps_avx512vl(auVar36);
    auVar35 = vfnmadd213ps_fma(auVar36,auVar38,auVar79);
    local_2590 = vfmadd132ps_fma(auVar35,auVar38,auVar38);
    auVar88 = ZEXT1664(local_2590);
    local_2600 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar78);
    auVar39 = vcmpps_avx(auVar39,auVar78,1);
    auVar35._8_4_ = 1;
    auVar35._0_8_ = 0x100000001;
    auVar35._12_4_ = 1;
    auVar35 = vandps_avx512vl(auVar39,auVar35);
    uVar27 = vcmpps_avx512vl(auVar32,auVar78,1);
    auVar56._8_4_ = 2;
    auVar56._0_8_ = 0x200000002;
    auVar56._12_4_ = 2;
    auVar39 = vpsubd_avx512vl(auVar56,auVar39);
    bVar8 = (bool)((byte)uVar27 & 1);
    auVar32._0_4_ = (uint)bVar8 * auVar39._0_4_ | (uint)!bVar8 * auVar35._0_4_;
    bVar8 = (bool)((byte)(uVar27 >> 1) & 1);
    auVar32._4_4_ = (uint)bVar8 * auVar39._4_4_ | (uint)!bVar8 * auVar35._4_4_;
    bVar8 = (bool)((byte)(uVar27 >> 2) & 1);
    auVar32._8_4_ = (uint)bVar8 * auVar39._8_4_ | (uint)!bVar8 * auVar35._8_4_;
    bVar8 = (bool)((byte)(uVar27 >> 3) & 1);
    auVar32._12_4_ = (uint)bVar8 * auVar39._12_4_ | (uint)!bVar8 * auVar35._12_4_;
    uVar27 = vcmpps_avx512vl(auVar33,auVar78,1);
    auVar39._8_4_ = 4;
    auVar39._0_8_ = 0x400000004;
    auVar39._12_4_ = 4;
    auVar39 = vpord_avx512vl(auVar32,auVar39);
    bVar8 = (bool)((byte)uVar27 & 1);
    auVar33._0_4_ = (uint)bVar8 * auVar39._0_4_ | !bVar8 * auVar32._0_4_;
    bVar8 = (bool)((byte)(uVar27 >> 1) & 1);
    auVar33._4_4_ = (uint)bVar8 * auVar39._4_4_ | !bVar8 * auVar32._4_4_;
    bVar8 = (bool)((byte)(uVar27 >> 2) & 1);
    auVar33._8_4_ = (uint)bVar8 * auVar39._8_4_ | !bVar8 * auVar32._8_4_;
    bVar8 = (bool)((byte)(uVar27 >> 3) & 1);
    auVar33._12_4_ = (uint)bVar8 * auVar39._12_4_ | !bVar8 * auVar32._12_4_;
    local_2610 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar78);
    auVar39 = vmovdqa32_avx512vl(auVar33);
    bVar8 = (bool)((byte)local_26b0 & 1);
    bVar9 = (bool)((byte)(local_26b0 >> 1) & 1);
    bVar10 = (bool)((byte)(local_26b0 >> 2) & 1);
    bVar12 = SUB81(local_26b0 >> 3,0);
    local_2670[0] = (uint)bVar8 * auVar39._0_4_ | (uint)!bVar8 * auVar40._0_4_;
    local_2670[1] = (uint)bVar9 * auVar39._4_4_ | (uint)!bVar9 * auVar40._4_4_;
    local_2670[2] = (uint)bVar10 * auVar39._8_4_ | (uint)!bVar10 * auVar40._8_4_;
    local_2670[3] = (uint)bVar12 * auVar39._12_4_ | (uint)!bVar12 * auVar40._12_4_;
    local_25d0 = *(float *)ray;
    fStack_25cc = *(float *)(ray + 4);
    fStack_25c8 = *(float *)(ray + 8);
    fStack_25c4 = *(float *)(ray + 0xc);
    local_25a0._0_4_ = local_2570._0_4_ * -*(float *)ray;
    local_25a0._4_4_ = local_2570._4_4_ * -*(float *)(ray + 4);
    local_25a0._8_4_ = local_2570._8_4_ * -*(float *)(ray + 8);
    local_25a0._12_4_ = local_2570._12_4_ * -*(float *)(ray + 0xc);
    auVar89 = ZEXT1664(local_25a0);
    local_25e0 = *(float *)(ray + 0x10);
    fStack_25dc = *(float *)(ray + 0x14);
    fStack_25d8 = *(float *)(ray + 0x18);
    fStack_25d4 = *(float *)(ray + 0x1c);
    local_25b0._0_4_ = local_2580._0_4_ * -*(float *)(ray + 0x10);
    local_25b0._4_4_ = local_2580._4_4_ * -*(float *)(ray + 0x14);
    local_25b0._8_4_ = local_2580._8_4_ * -*(float *)(ray + 0x18);
    local_25b0._12_4_ = local_2580._12_4_ * -*(float *)(ray + 0x1c);
    auVar90 = ZEXT1664(local_25b0);
    local_25f0 = *(float *)(ray + 0x20);
    fStack_25ec = *(float *)(ray + 0x24);
    fStack_25e8 = *(float *)(ray + 0x28);
    fStack_25e4 = *(float *)(ray + 0x2c);
    local_25c0._0_4_ = local_2590._0_4_ * -*(float *)(ray + 0x20);
    local_25c0._4_4_ = local_2590._4_4_ * -*(float *)(ray + 0x24);
    local_25c0._8_4_ = local_2590._8_4_ * -*(float *)(ray + 0x28);
    local_25c0._12_4_ = local_2590._12_4_ * -*(float *)(ray + 0x2c);
    auVar91 = ZEXT1664(local_25c0);
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
    auVar92 = ZEXT1664(auVar40);
    local_26a8 = ray;
    local_26a0 = context;
    do {
      lVar25 = 0;
      for (uVar27 = local_26b0; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar23 = local_2670[lVar25];
      auVar63._4_4_ = uVar23;
      auVar63._0_4_ = uVar23;
      auVar63._8_4_ = uVar23;
      auVar63._12_4_ = uVar23;
      auVar40._4_4_ = local_2670[1];
      auVar40._0_4_ = local_2670[0];
      auVar40._8_4_ = local_2670[2];
      auVar40._12_4_ = local_2670[3];
      uVar30 = vpcmpeqd_avx512vl(auVar63,auVar40);
      uVar30 = uVar30 & 0xf;
      bVar29 = (byte)uVar30;
      local_26b0 = (long)(char)~bVar29 & local_26b0;
      auVar20._4_4_ = fStack_25cc;
      auVar20._0_4_ = local_25d0;
      auVar20._8_4_ = fStack_25c8;
      auVar20._12_4_ = fStack_25c4;
      auVar34 = auVar92._0_16_;
      auVar40 = vblendmps_avx512vl(auVar34,auVar20);
      auVar41._0_4_ = (uint)(bVar29 & 1) * auVar40._0_4_ | !(bool)(bVar29 & 1) * uVar23;
      bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
      auVar41._4_4_ = (uint)bVar8 * auVar40._4_4_ | !bVar8 * uVar23;
      bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
      auVar41._8_4_ = (uint)bVar8 * auVar40._8_4_ | !bVar8 * uVar23;
      bVar8 = SUB81(uVar30 >> 3,0);
      auVar41._12_4_ = (uint)bVar8 * auVar40._12_4_ | !bVar8 * uVar23;
      auVar40 = vshufps_avx(auVar41,auVar41,0xb1);
      auVar40 = vminps_avx(auVar40,auVar41);
      auVar39 = vshufpd_avx(auVar40,auVar40,1);
      auVar40 = vminps_avx(auVar39,auVar40);
      auVar19._4_4_ = fStack_25dc;
      auVar19._0_4_ = local_25e0;
      auVar19._8_4_ = fStack_25d8;
      auVar19._12_4_ = fStack_25d4;
      auVar32 = vblendmps_avx512vl(auVar34,auVar19);
      auVar42._0_4_ = (uint)(bVar29 & 1) * auVar32._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar39._0_4_
      ;
      bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
      auVar42._4_4_ = (uint)bVar8 * auVar32._4_4_ | (uint)!bVar8 * auVar39._4_4_;
      bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
      auVar42._8_4_ = (uint)bVar8 * auVar32._8_4_ | (uint)!bVar8 * auVar39._8_4_;
      bVar8 = SUB81(uVar30 >> 3,0);
      auVar42._12_4_ = (uint)bVar8 * auVar32._12_4_ | (uint)!bVar8 * auVar39._12_4_;
      auVar39 = vshufps_avx(auVar42,auVar42,0xb1);
      auVar39 = vminps_avx(auVar39,auVar42);
      auVar32 = vshufpd_avx(auVar39,auVar39,1);
      auVar39 = vminps_avx(auVar32,auVar39);
      auVar40 = vinsertps_avx(auVar40,auVar39,0x1c);
      auVar18._4_4_ = fStack_25ec;
      auVar18._0_4_ = local_25f0;
      auVar18._8_4_ = fStack_25e8;
      auVar18._12_4_ = fStack_25e4;
      auVar32 = vblendmps_avx512vl(auVar34,auVar18);
      auVar43._0_4_ = (uint)(bVar29 & 1) * auVar32._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar39._0_4_
      ;
      bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
      auVar43._4_4_ = (uint)bVar8 * auVar32._4_4_ | (uint)!bVar8 * auVar39._4_4_;
      bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
      auVar43._8_4_ = (uint)bVar8 * auVar32._8_4_ | (uint)!bVar8 * auVar39._8_4_;
      bVar8 = SUB81(uVar30 >> 3,0);
      auVar43._12_4_ = (uint)bVar8 * auVar32._12_4_ | (uint)!bVar8 * auVar39._12_4_;
      auVar39 = vshufps_avx(auVar43,auVar43,0xb1);
      auVar39 = vminps_avx(auVar39,auVar43);
      auVar32 = vshufpd_avx(auVar39,auVar39,1);
      auVar39 = vminps_avx(auVar32,auVar39);
      auVar39 = vinsertps_avx(auVar40,auVar39,0x20);
      auVar81._8_4_ = 0xff800000;
      auVar81._0_8_ = 0xff800000ff800000;
      auVar81._12_4_ = 0xff800000;
      auVar32 = vblendmps_avx512vl(auVar81,auVar20);
      auVar44._0_4_ = (uint)(bVar29 & 1) * auVar32._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar40._0_4_
      ;
      bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
      auVar44._4_4_ = (uint)bVar8 * auVar32._4_4_ | (uint)!bVar8 * auVar40._4_4_;
      bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
      auVar44._8_4_ = (uint)bVar8 * auVar32._8_4_ | (uint)!bVar8 * auVar40._8_4_;
      bVar8 = SUB81(uVar30 >> 3,0);
      auVar44._12_4_ = (uint)bVar8 * auVar32._12_4_ | (uint)!bVar8 * auVar40._12_4_;
      auVar40 = vshufps_avx(auVar44,auVar44,0xb1);
      auVar40 = vmaxps_avx(auVar40,auVar44);
      auVar32 = vshufpd_avx(auVar40,auVar40,1);
      auVar40 = vmaxps_avx(auVar32,auVar40);
      auVar33 = vblendmps_avx512vl(auVar81,auVar19);
      auVar45._0_4_ = (uint)(bVar29 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar32._0_4_
      ;
      bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
      auVar45._4_4_ = (uint)bVar8 * auVar33._4_4_ | (uint)!bVar8 * auVar32._4_4_;
      bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
      auVar45._8_4_ = (uint)bVar8 * auVar33._8_4_ | (uint)!bVar8 * auVar32._8_4_;
      bVar8 = SUB81(uVar30 >> 3,0);
      auVar45._12_4_ = (uint)bVar8 * auVar33._12_4_ | (uint)!bVar8 * auVar32._12_4_;
      auVar32 = vshufps_avx(auVar45,auVar45,0xb1);
      auVar32 = vmaxps_avx(auVar32,auVar45);
      auVar33 = vshufpd_avx(auVar32,auVar32,1);
      auVar32 = vmaxps_avx(auVar33,auVar32);
      auVar40 = vinsertps_avx(auVar40,auVar32,0x1c);
      auVar33 = vblendmps_avx512vl(auVar81,auVar18);
      auVar46._0_4_ = (uint)(bVar29 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar32._0_4_
      ;
      bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
      auVar46._4_4_ = (uint)bVar8 * auVar33._4_4_ | (uint)!bVar8 * auVar32._4_4_;
      bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
      auVar46._8_4_ = (uint)bVar8 * auVar33._8_4_ | (uint)!bVar8 * auVar32._8_4_;
      bVar8 = SUB81(uVar30 >> 3,0);
      auVar46._12_4_ = (uint)bVar8 * auVar33._12_4_ | (uint)!bVar8 * auVar32._12_4_;
      auVar32 = vshufps_avx(auVar46,auVar46,0xb1);
      auVar32 = vmaxps_avx(auVar32,auVar46);
      auVar33 = vshufpd_avx(auVar32,auVar32,1);
      auVar32 = vmaxps_avx(auVar33,auVar32);
      auVar32 = vinsertps_avx(auVar40,auVar32,0x20);
      auVar33 = vblendmps_avx512vl(auVar34,auVar86._0_16_);
      auVar47._0_4_ = (uint)(bVar29 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar40._0_4_
      ;
      bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
      auVar47._4_4_ = (uint)bVar8 * auVar33._4_4_ | (uint)!bVar8 * auVar40._4_4_;
      bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
      auVar47._8_4_ = (uint)bVar8 * auVar33._8_4_ | (uint)!bVar8 * auVar40._8_4_;
      bVar8 = SUB81(uVar30 >> 3,0);
      auVar47._12_4_ = (uint)bVar8 * auVar33._12_4_ | (uint)!bVar8 * auVar40._12_4_;
      auVar40 = vshufps_avx(auVar47,auVar47,0xb1);
      auVar40 = vminps_avx(auVar40,auVar47);
      auVar33 = vshufpd_avx(auVar40,auVar40,1);
      auVar40 = vminps_avx(auVar33,auVar40);
      auVar35 = vblendmps_avx512vl(auVar34,auVar87._0_16_);
      auVar48._0_4_ = (uint)(bVar29 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar33._0_4_
      ;
      bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
      auVar48._4_4_ = (uint)bVar8 * auVar35._4_4_ | (uint)!bVar8 * auVar33._4_4_;
      bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
      auVar48._8_4_ = (uint)bVar8 * auVar35._8_4_ | (uint)!bVar8 * auVar33._8_4_;
      bVar8 = SUB81(uVar30 >> 3,0);
      auVar48._12_4_ = (uint)bVar8 * auVar35._12_4_ | (uint)!bVar8 * auVar33._12_4_;
      auVar33 = vshufps_avx(auVar48,auVar48,0xb1);
      auVar33 = vminps_avx(auVar33,auVar48);
      auVar35 = vshufpd_avx(auVar33,auVar33,1);
      auVar33 = vminps_avx(auVar35,auVar33);
      auVar40 = vinsertps_avx(auVar40,auVar33,0x1c);
      auVar35 = vblendmps_avx512vl(auVar34,auVar88._0_16_);
      auVar49._0_4_ = (uint)(bVar29 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar33._0_4_
      ;
      bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
      auVar49._4_4_ = (uint)bVar8 * auVar35._4_4_ | (uint)!bVar8 * auVar33._4_4_;
      bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
      auVar49._8_4_ = (uint)bVar8 * auVar35._8_4_ | (uint)!bVar8 * auVar33._8_4_;
      bVar8 = SUB81(uVar30 >> 3,0);
      auVar49._12_4_ = (uint)bVar8 * auVar35._12_4_ | (uint)!bVar8 * auVar33._12_4_;
      auVar33 = vshufps_avx(auVar49,auVar49,0xb1);
      auVar33 = vminps_avx(auVar33,auVar49);
      auVar35 = vshufpd_avx(auVar33,auVar33,1);
      auVar33 = vminps_avx(auVar35,auVar33);
      auVar40 = vinsertps_avx(auVar40,auVar33,0x20);
      auVar35 = vblendmps_avx512vl(auVar81,auVar86._0_16_);
      auVar50._0_4_ = (uint)(bVar29 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar33._0_4_
      ;
      bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
      auVar50._4_4_ = (uint)bVar8 * auVar35._4_4_ | (uint)!bVar8 * auVar33._4_4_;
      bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
      auVar50._8_4_ = (uint)bVar8 * auVar35._8_4_ | (uint)!bVar8 * auVar33._8_4_;
      bVar8 = SUB81(uVar30 >> 3,0);
      auVar50._12_4_ = (uint)bVar8 * auVar35._12_4_ | (uint)!bVar8 * auVar33._12_4_;
      auVar33 = vshufps_avx(auVar50,auVar50,0xb1);
      auVar33 = vmaxps_avx(auVar33,auVar50);
      auVar35 = vshufpd_avx(auVar33,auVar33,1);
      auVar33 = vmaxps_avx(auVar35,auVar33);
      auVar38 = vblendmps_avx512vl(auVar81,auVar87._0_16_);
      auVar51._0_4_ = (uint)(bVar29 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar35._0_4_
      ;
      bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
      auVar51._4_4_ = (uint)bVar8 * auVar38._4_4_ | (uint)!bVar8 * auVar35._4_4_;
      bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
      auVar51._8_4_ = (uint)bVar8 * auVar38._8_4_ | (uint)!bVar8 * auVar35._8_4_;
      bVar8 = SUB81(uVar30 >> 3,0);
      auVar51._12_4_ = (uint)bVar8 * auVar38._12_4_ | (uint)!bVar8 * auVar35._12_4_;
      auVar35 = vshufps_avx(auVar51,auVar51,0xb1);
      auVar35 = vmaxps_avx(auVar35,auVar51);
      auVar38 = vshufpd_avx(auVar35,auVar35,1);
      auVar35 = vmaxps_avx(auVar38,auVar35);
      auVar33 = vinsertps_avx(auVar33,auVar35,0x1c);
      auVar38 = vblendmps_avx512vl(auVar81,auVar88._0_16_);
      auVar52._0_4_ = (uint)(bVar29 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar35._0_4_
      ;
      bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
      auVar52._4_4_ = (uint)bVar8 * auVar38._4_4_ | (uint)!bVar8 * auVar35._4_4_;
      bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
      auVar52._8_4_ = (uint)bVar8 * auVar38._8_4_ | (uint)!bVar8 * auVar35._8_4_;
      bVar8 = SUB81(uVar30 >> 3,0);
      auVar52._12_4_ = (uint)bVar8 * auVar38._12_4_ | (uint)!bVar8 * auVar35._12_4_;
      auVar35 = vshufps_avx(auVar52,auVar52,0xb1);
      auVar35 = vmaxps_avx(auVar35,auVar52);
      auVar38 = vshufpd_avx(auVar35,auVar35,1);
      auVar35 = vmaxps_avx(auVar38,auVar35);
      auVar33 = vinsertps_avx(auVar33,auVar35,0x20);
      auVar38 = vblendmps_avx512vl(auVar34,local_2600);
      auVar53._0_4_ = (uint)(bVar29 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar35._0_4_
      ;
      bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
      auVar53._4_4_ = (uint)bVar8 * auVar38._4_4_ | (uint)!bVar8 * auVar35._4_4_;
      bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
      auVar53._8_4_ = (uint)bVar8 * auVar38._8_4_ | (uint)!bVar8 * auVar35._8_4_;
      bVar8 = SUB81(uVar30 >> 3,0);
      auVar53._12_4_ = (uint)bVar8 * auVar38._12_4_ | (uint)!bVar8 * auVar35._12_4_;
      auVar35 = vshufps_avx(auVar53,auVar53,0xb1);
      auVar35 = vminps_avx(auVar35,auVar53);
      auVar34 = vshufpd_avx(auVar35,auVar35,1);
      auVar38 = vblendmps_avx512vl(auVar81,local_2610);
      auVar54._0_4_ =
           (uint)(bVar29 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM18._0_4_;
      bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
      auVar54._4_4_ = (uint)bVar8 * auVar38._4_4_ | (uint)!bVar8 * in_ZMM18._4_4_;
      bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
      auVar54._8_4_ = (uint)bVar8 * auVar38._8_4_ | (uint)!bVar8 * in_ZMM18._8_4_;
      bVar8 = SUB81(uVar30 >> 3,0);
      auVar54._12_4_ = (uint)bVar8 * auVar38._12_4_ | (uint)!bVar8 * in_ZMM18._12_4_;
      in_ZMM18 = ZEXT1664(auVar54);
      auVar38 = vshufps_avx512vl(auVar54,auVar54,0xb1);
      auVar38 = vmaxps_avx512vl(auVar38,auVar54);
      auVar36 = vshufpd_avx(auVar38,auVar38,1);
      local_26d0 = vmaxps_avx512vl(auVar36,auVar38);
      uVar27 = vcmpps_avx512vl(auVar40,ZEXT816(0) << 0x20,5);
      auVar38 = vblendmps_avx512vl(auVar33,auVar40);
      bVar7 = (byte)uVar27;
      fVar75 = (float)((uint)(bVar7 & 1) * auVar38._0_4_);
      fVar1 = (float)((uint)((byte)(uVar27 >> 1) & 1) * auVar38._4_4_);
      auVar55._4_4_ = fVar1;
      auVar55._0_4_ = fVar75;
      fVar2 = (float)((uint)((byte)(uVar27 >> 2) & 1) * auVar38._8_4_);
      auVar55._8_4_ = fVar2;
      fVar3 = (float)((uint)((byte)(uVar27 >> 3) & 1) * auVar38._12_4_);
      auVar55._12_4_ = fVar3;
      auVar56 = vblendmps_avx512vl(auVar39,auVar32);
      bVar8 = (bool)((byte)(uVar27 >> 1) & 1);
      bVar12 = (bool)((byte)(uVar27 >> 2) & 1);
      bVar13 = (bool)((byte)(uVar27 >> 3) & 1);
      bVar9 = (bool)((byte)(uVar27 >> 1) & 1);
      bVar11 = (bool)((byte)(uVar27 >> 2) & 1);
      bVar14 = (bool)((byte)(uVar27 >> 3) & 1);
      vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
      vucomiss_avx512f(auVar55);
      auVar38 = vmovshdup_avx(auVar55);
      vucomiss_avx512f(auVar38);
      lVar26 = 0x40;
      auVar37 = vshufpd_avx(auVar55,auVar55,1);
      vucomiss_avx512f(auVar37);
      local_2678 = 0x60;
      auVar35 = vminps_avx(auVar34,auVar35);
      auVar57._0_4_ =
           (float)((uint)(bVar7 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar40._0_4_);
      bVar10 = (bool)((byte)(uVar27 >> 1) & 1);
      auVar57._4_4_ = (float)((uint)bVar10 * auVar33._4_4_ | (uint)!bVar10 * auVar40._4_4_);
      bVar10 = (bool)((byte)(uVar27 >> 2) & 1);
      auVar57._8_4_ = (float)((uint)bVar10 * auVar33._8_4_ | (uint)!bVar10 * auVar40._8_4_);
      bVar10 = (bool)((byte)(uVar27 >> 3) & 1);
      auVar57._12_4_ = (float)((uint)bVar10 * auVar33._12_4_ | (uint)!bVar10 * auVar40._12_4_);
      fVar75 = (float)((uint)(bVar7 & 1) * auVar56._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar36._0_4_)
               * fVar75;
      fVar67 = (float)((uint)(bVar7 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar32._0_4_)
               * auVar57._0_4_;
      fVar70 = (float)((uint)bVar9 * auVar39._4_4_ | (uint)!bVar9 * auVar32._4_4_) * auVar57._4_4_;
      fVar71 = (float)((uint)bVar11 * auVar39._8_4_ | (uint)!bVar11 * auVar32._8_4_) * auVar57._8_4_
      ;
      fVar72 = (float)((uint)bVar14 * auVar39._12_4_ | (uint)!bVar14 * auVar32._12_4_) *
               auVar57._12_4_;
      lVar25 = 0;
      local_23a0 = *(ulong *)&local_26b8[1].bounds.bounds0.lower.field_0;
      local_2398[0] = 0;
      local_23c0 = vbroadcastss_avx512vl(auVar55);
      in_ZMM17 = ZEXT3264(local_23c0);
      auVar60._4_4_ = fVar75;
      auVar60._0_4_ = fVar75;
      auVar60._8_4_ = fVar75;
      auVar60._12_4_ = fVar75;
      auVar60._16_4_ = fVar75;
      auVar60._20_4_ = fVar75;
      auVar60._24_4_ = fVar75;
      auVar60._28_4_ = fVar75;
      auVar84._8_4_ = 0x80000000;
      auVar84._0_8_ = 0x8000000080000000;
      auVar84._12_4_ = 0x80000000;
      auVar84._16_4_ = 0x80000000;
      auVar84._20_4_ = 0x80000000;
      auVar84._24_4_ = 0x80000000;
      auVar84._28_4_ = 0x80000000;
      local_23e0 = vxorps_avx512vl(auVar60,auVar84);
      auVar94 = ZEXT3264(local_23e0);
      local_2400 = vbroadcastsd_avx512vl(auVar38);
      auVar95 = ZEXT3264(local_2400);
      auVar61._8_4_ = 1;
      auVar61._0_8_ = 0x100000001;
      auVar61._12_4_ = 1;
      auVar61._16_4_ = 1;
      auVar61._20_4_ = 1;
      auVar61._24_4_ = 1;
      auVar61._28_4_ = 1;
      auVar60 = ZEXT1632(CONCAT412((float)((uint)bVar13 * auVar56._12_4_ |
                                          (uint)!bVar13 * auVar36._12_4_) * fVar3,
                                   CONCAT48((float)((uint)bVar12 * auVar56._8_4_ |
                                                   (uint)!bVar12 * auVar36._8_4_) * fVar2,
                                            CONCAT44((float)((uint)bVar8 * auVar56._4_4_ |
                                                            (uint)!bVar8 * auVar36._4_4_) * fVar1,
                                                     fVar75))));
      auVar59 = vpermps_avx2(auVar61,auVar60);
      local_2420 = vxorps_avx512vl(auVar59,auVar84);
      auVar96 = ZEXT3264(local_2420);
      auVar85._8_4_ = 2;
      auVar85._0_8_ = 0x200000002;
      auVar85._12_4_ = 2;
      auVar85._16_4_ = 2;
      auVar85._20_4_ = 2;
      auVar85._24_4_ = 2;
      auVar85._28_4_ = 2;
      local_2440 = vpermps_avx512vl(auVar85,ZEXT1632(auVar55));
      auVar97 = ZEXT3264(local_2440);
      auVar59 = vpermps_avx2(auVar85,auVar60);
      local_2460 = vxorps_avx512vl(auVar59,auVar84);
      auVar98 = ZEXT3264(local_2460);
      local_2480 = vbroadcastss_avx512vl(auVar57);
      auVar99 = ZEXT3264(local_2480);
      auVar59._4_4_ = fVar67;
      auVar59._0_4_ = fVar67;
      auVar59._8_4_ = fVar67;
      auVar59._12_4_ = fVar67;
      auVar59._16_4_ = fVar67;
      auVar59._20_4_ = fVar67;
      auVar59._24_4_ = fVar67;
      auVar59._28_4_ = fVar67;
      local_24a0 = vxorps_avx512vl(auVar59,auVar84);
      auVar100 = ZEXT3264(local_24a0);
      local_24c0 = vpermps_avx512vl(auVar61,ZEXT1632(auVar57));
      auVar101 = ZEXT3264(local_24c0);
      auVar60 = ZEXT1632(CONCAT412(fVar72,CONCAT48(fVar71,CONCAT44(fVar70,fVar67))));
      auVar59 = vpermps_avx2(auVar61,auVar60);
      local_24e0 = vxorps_avx512vl(auVar59,auVar84);
      auVar102 = ZEXT3264(local_24e0);
      local_2500 = vpermps_avx512vl(auVar85,ZEXT1632(auVar57));
      auVar103 = ZEXT3264(local_2500);
      auVar59 = vpermps_avx2(auVar85,auVar60);
      local_2520 = vxorps_avx512vl(auVar59,auVar84);
      auVar104 = ZEXT3264(local_2520);
      local_2540 = vbroadcastss_avx512vl(auVar35);
      auVar105 = ZEXT3264(local_2540);
      auVar64._8_4_ = 0x7f800000;
      auVar64._0_8_ = 0x7f8000007f800000;
      auVar64._12_4_ = 0x7f800000;
      auVar40 = vpblendmd_avx512vl(auVar64,local_2600);
      local_2560._0_4_ =
           (uint)(bVar29 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar29 & 1) * (int)fVar67;
      bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
      local_2560._4_4_ = (uint)bVar8 * auVar40._4_4_ | (uint)!bVar8 * (int)fVar70;
      bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
      local_2560._8_4_ = (uint)bVar8 * auVar40._8_4_ | (uint)!bVar8 * (int)fVar71;
      bVar8 = SUB81(uVar30 >> 3,0);
      local_2560._12_4_ = (uint)bVar8 * auVar40._12_4_ | (uint)!bVar8 * (int)fVar72;
      auVar59 = vbroadcastss_avx512vl(local_26d0);
      auVar66 = ZEXT3264(auVar59);
      auVar40 = vmovdqa64_avx512vl(local_2560);
      auVar93 = ZEXT1664(auVar40);
      puVar22 = local_2390;
      local_2690 = 0;
      local_2698 = 0x40;
      do {
        uVar62 = (undefined4)puVar22[-1];
        auVar68._4_4_ = uVar62;
        auVar68._0_4_ = uVar62;
        auVar68._8_4_ = uVar62;
        auVar68._12_4_ = uVar62;
        auVar69 = ZEXT1664(auVar68);
        puVar22 = puVar22 + -2;
        local_2550 = in_ZMM18._0_16_;
        uVar15 = vcmpps_avx512vl(auVar68,local_2550,1);
        if ((char)uVar15 != '\0') {
          uVar27 = *puVar22;
          while ((uVar27 & 8) == 0) {
            auVar59 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar27 + 0x40 + lVar25),auVar94._0_32_,
                                 in_ZMM17._0_32_);
            auVar60 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar27 + 0x40 + lVar26),auVar96._0_32_,
                                 auVar95._0_32_);
            auVar59 = vpmaxsd_avx2(auVar59,auVar60);
            auVar60 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar27 + 0xc0),auVar98._0_32_,auVar97._0_32_
                                );
            auVar60 = vpmaxsd_avx512vl(auVar60,auVar105._0_32_);
            auVar59 = vpmaxsd_avx2(auVar59,auVar60);
            auVar60 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar27 + 0x60),auVar100._0_32_,
                                 auVar99._0_32_);
            auVar61 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar27 + 0x40 + local_2678),auVar102._0_32_,
                                 auVar101._0_32_);
            auVar60 = vpminsd_avx2(auVar60,auVar61);
            auVar61 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar27 + 0xe0),auVar104._0_32_,
                                 auVar103._0_32_);
            auVar61 = vpminsd_avx2(auVar61,auVar66._0_32_);
            auVar60 = vpminsd_avx2(auVar60,auVar61);
            local_2660.valid = (int *)auVar59._0_8_;
            local_2660.geometryUserPtr = (void *)auVar59._8_8_;
            local_2660.primID = auVar59._16_4_;
            local_2660._20_4_ = auVar59._20_4_;
            local_2660.context = (RTCRayQueryContext *)auVar59._24_8_;
            uVar30 = vcmpps_avx512vl(auVar59,auVar60,2);
            if ((char)uVar30 == '\0') goto LAB_007b092e;
            auVar69 = ZEXT1664(auVar92._0_16_);
            uVar24 = 0;
            uVar31 = 8;
            do {
              lVar17 = 0;
              for (uVar28 = uVar30; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
                lVar17 = lVar17 + 1;
              }
              uVar62 = *(undefined4 *)(uVar27 + 0x40 + lVar17 * 4);
              auVar73._4_4_ = uVar62;
              auVar73._0_4_ = uVar62;
              auVar73._8_4_ = uVar62;
              auVar73._12_4_ = uVar62;
              auVar32 = vfmadd132ps_fma(auVar73,auVar89._0_16_,auVar86._0_16_);
              uVar62 = *(undefined4 *)(uVar27 + 0x80 + lVar17 * 4);
              auVar76._4_4_ = uVar62;
              auVar76._0_4_ = uVar62;
              auVar76._8_4_ = uVar62;
              auVar76._12_4_ = uVar62;
              auVar33 = vfmadd132ps_fma(auVar76,auVar90._0_16_,auVar87._0_16_);
              uVar62 = *(undefined4 *)(uVar27 + 0xc0 + lVar17 * 4);
              auVar77._4_4_ = uVar62;
              auVar77._0_4_ = uVar62;
              auVar77._8_4_ = uVar62;
              auVar77._12_4_ = uVar62;
              auVar35 = vfmadd132ps_fma(auVar77,auVar91._0_16_,auVar88._0_16_);
              uVar62 = *(undefined4 *)(uVar27 + 0x60 + lVar17 * 4);
              auVar80._4_4_ = uVar62;
              auVar80._0_4_ = uVar62;
              auVar80._8_4_ = uVar62;
              auVar80._12_4_ = uVar62;
              auVar38 = vfmadd132ps_fma(auVar80,auVar89._0_16_,auVar86._0_16_);
              uVar62 = *(undefined4 *)(uVar27 + 0xa0 + lVar17 * 4);
              auVar82._4_4_ = uVar62;
              auVar82._0_4_ = uVar62;
              auVar82._8_4_ = uVar62;
              auVar82._12_4_ = uVar62;
              auVar34 = vfmadd132ps_fma(auVar82,auVar90._0_16_,auVar87._0_16_);
              uVar62 = *(undefined4 *)(uVar27 + 0xe0 + lVar17 * 4);
              auVar83._4_4_ = uVar62;
              auVar83._0_4_ = uVar62;
              auVar83._8_4_ = uVar62;
              auVar83._12_4_ = uVar62;
              auVar36 = vfmadd132ps_fma(auVar83,auVar91._0_16_,auVar88._0_16_);
              auVar40 = vpminsd_avx(auVar32,auVar38);
              auVar39 = vpminsd_avx(auVar33,auVar34);
              auVar40 = vpmaxsd_avx(auVar40,auVar39);
              auVar39 = vpminsd_avx(auVar35,auVar36);
              auVar39 = vpmaxsd_avx512vl(auVar39,auVar93._0_16_);
              auVar40 = vpmaxsd_avx(auVar40,auVar39);
              auVar39 = vpmaxsd_avx(auVar32,auVar38);
              auVar32 = vpmaxsd_avx(auVar33,auVar34);
              auVar32 = vpminsd_avx(auVar39,auVar32);
              auVar39 = vpmaxsd_avx(auVar35,auVar36);
              auVar39 = vpminsd_avx512vl(auVar39,local_2550);
              auVar39 = vpminsd_avx(auVar32,auVar39);
              uVar16 = vpcmpd_avx512vl(auVar40,auVar39,2);
              uVar28 = uVar31;
              if ((uVar16 & 0xf) != 0) {
                uVar62 = *(undefined4 *)((long)&local_2660.valid + lVar17 * 4);
                auVar74._4_4_ = uVar62;
                auVar74._0_4_ = uVar62;
                auVar74._8_4_ = uVar62;
                auVar74._12_4_ = uVar62;
                uVar28 = *(ulong *)(uVar27 + lVar17 * 8);
                auVar40 = auVar69._0_16_;
                uVar15 = vcmpps_avx512vl(auVar74,auVar40,1);
                if ((char)uVar15 == '\0') {
                  *puVar22 = uVar28;
                  uVar28 = uVar31;
                }
                else {
                  if (uVar31 == 8) {
                    auVar69 = ZEXT1664(auVar74);
                    goto LAB_007b0637;
                  }
                  *puVar22 = uVar31;
                  auVar69 = ZEXT1664(auVar74);
                  auVar74 = auVar40;
                }
                uVar24 = uVar24 + 1;
                *(int *)(puVar22 + 1) = auVar74._0_4_;
                puVar22 = puVar22 + 2;
              }
LAB_007b0637:
              uVar30 = uVar30 - 1 & uVar30;
              uVar31 = uVar28;
            } while (uVar30 != 0);
            if (uVar28 == 8) goto LAB_007b092e;
            uVar27 = uVar28;
            if (1 < uVar24) {
              puVar4 = puVar22 + -4;
              puVar5 = puVar22 + -2;
              if ((uint)puVar22[-3] < (uint)puVar22[-1]) {
                uVar30 = *puVar4;
                uVar31 = puVar22[-3];
                *(int *)(puVar22 + -3) = (int)puVar22[-1];
                *puVar4 = *puVar5;
                *puVar5 = uVar30;
                local_26e0._8_4_ = (undefined4)uVar31;
                *(undefined4 *)(puVar22 + -1) = local_26e0._8_4_;
              }
              if (uVar24 != 2) {
                puVar6 = puVar22 + -6;
                uVar23 = (uint)puVar22[-5];
                if (uVar23 < (uint)puVar22[-1]) {
                  uVar30 = *puVar6;
                  uVar31 = puVar22[-5];
                  *(int *)(puVar22 + -5) = (int)puVar22[-1];
                  *puVar6 = *puVar5;
                  *puVar5 = uVar30;
                  local_26e0._8_4_ = (undefined4)uVar31;
                  *(undefined4 *)(puVar22 + -1) = local_26e0._8_4_;
                  uVar23 = (uint)puVar22[-5];
                }
                if (uVar23 < (uint)puVar22[-3]) {
                  uVar30 = *puVar6;
                  uVar31 = puVar22[-5];
                  *(int *)(puVar22 + -5) = (int)puVar22[-3];
                  *puVar6 = *puVar4;
                  *puVar4 = uVar30;
                  local_26e0._8_4_ = (undefined4)uVar31;
                  *(undefined4 *)(puVar22 + -3) = local_26e0._8_4_;
                }
              }
            }
          }
          uVar30 = vcmpps_avx512vl(local_2550,auVar69._0_16_,6);
          if ((char)uVar30 != '\0') {
            local_2688 = (ulong)((uint)uVar27 & 0xf) - 8;
            uVar31 = uVar30;
            if (local_2688 != 0) {
              local_2680 = 0;
              do {
                local_2660.geomID = *(uint *)((uVar27 & 0xfffffffffffffff0) + local_2680 * 8);
                local_2630 = (context->scene->geometries).items[local_2660.geomID].ptr;
                uVar23 = local_2630->mask;
                auVar65._4_4_ = uVar23;
                auVar65._0_4_ = uVar23;
                auVar65._8_4_ = uVar23;
                auVar65._12_4_ = uVar23;
                uVar15 = vptestmd_avx512vl(auVar65,*(undefined1 (*) [16])(ray + 0x90));
                bVar7 = (byte)uVar15 & 0xf & (byte)uVar31;
                if (bVar7 != 0) {
                  local_26e0 = vpmovm2d_avx512vl((ulong)bVar7);
                  local_2660.geometryUserPtr = local_2630->userPtr;
                  local_2660.valid = (int *)local_26e0;
                  auVar40 = (undefined1  [16])local_2660._0_16_;
                  local_2660.context = context->user;
                  local_2660.N = 4;
                  local_2660.primID =
                       *(undefined4 *)((uVar27 & 0xfffffffffffffff0) + 4 + local_2680 * 8);
                  local_2660._0_20_ = CONCAT416(local_2660.primID,auVar40);
                  local_2628 = 0;
                  local_2620 = context->args;
                  pp_Var21 = (_func_int **)local_2620->intersect;
                  if (pp_Var21 == (_func_int **)0x0) {
                    pp_Var21 = local_2630[1].super_RefCount._vptr_RefCount;
                  }
                  local_2660.rayhit = (RTCRayHitN *)ray;
                  (*(code *)pp_Var21)(&local_2660);
                  auVar86 = ZEXT1664(local_2570);
                  auVar87 = ZEXT1664(local_2580);
                  auVar88 = ZEXT1664(local_2590);
                  auVar89 = ZEXT1664(local_25a0);
                  auVar90 = ZEXT1664(local_25b0);
                  auVar91 = ZEXT1664(local_25c0);
                  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar92 = ZEXT1664(auVar40);
                  in_ZMM18 = ZEXT1664(local_2550);
                  in_ZMM17 = ZEXT3264(local_23c0);
                  auVar94 = ZEXT3264(local_23e0);
                  auVar95 = ZEXT3264(local_2400);
                  auVar96 = ZEXT3264(local_2420);
                  auVar97 = ZEXT3264(local_2440);
                  auVar98 = ZEXT3264(local_2460);
                  auVar99 = ZEXT3264(local_2480);
                  auVar100 = ZEXT3264(local_24a0);
                  auVar101 = ZEXT3264(local_24c0);
                  auVar102 = ZEXT3264(local_24e0);
                  auVar103 = ZEXT3264(local_2500);
                  auVar104 = ZEXT3264(local_2520);
                  auVar105 = ZEXT3264(local_2540);
                  auVar40 = vmovdqa64_avx512vl(local_2560);
                  auVar93 = ZEXT1664(auVar40);
                  uVar31 = uVar30 & 0xffff;
                  context = local_26a0;
                  ray = local_26a8;
                  lVar25 = local_2690;
                  lVar26 = local_2698;
                }
                local_2680 = local_2680 + 1;
              } while (local_2688 != local_2680);
            }
            auVar40 = *(undefined1 (*) [16])(ray + 0x80);
            uVar15 = vcmpps_avx512vl(auVar40,in_ZMM18._0_16_,1);
            if ((byte)((byte)uVar15 & (byte)uVar31) != 0) {
              bVar8 = (bool)((byte)uVar31 & 1);
              auVar58._0_4_ = (uint)bVar8 * auVar40._0_4_ | (uint)!bVar8 * in_ZMM18._0_4_;
              bVar8 = (bool)((byte)(uVar31 >> 1) & 1);
              auVar58._4_4_ = (uint)bVar8 * auVar40._4_4_ | (uint)!bVar8 * in_ZMM18._4_4_;
              bVar8 = (bool)((byte)(uVar31 >> 2) & 1);
              auVar58._8_4_ = (uint)bVar8 * auVar40._8_4_ | (uint)!bVar8 * in_ZMM18._8_4_;
              bVar8 = (bool)((byte)(uVar31 >> 3) & 1);
              auVar58._12_4_ = (uint)bVar8 * auVar40._12_4_ | (uint)!bVar8 * in_ZMM18._12_4_;
              in_ZMM18 = ZEXT1664(auVar58);
              auVar40 = vshufps_avx512vl(auVar58,auVar58,0xb1);
              auVar39 = vmaxps_avx512vl(auVar40,auVar58);
              auVar40 = vshufpd_avx(auVar39,auVar39,1);
              local_26d0 = vmaxss_avx(auVar40,auVar39);
            }
          }
        }
        uVar62 = local_26d0._0_4_;
        auVar66 = ZEXT3264(CONCAT428(uVar62,CONCAT424(uVar62,CONCAT420(uVar62,CONCAT416(uVar62,
                                                  CONCAT412(uVar62,CONCAT48(uVar62,CONCAT44(uVar62,
                                                  uVar62))))))));
LAB_007b092e:
      } while (puVar22 != &local_23a0);
    } while (local_26b0 != 0);
  }
  return;
}

Assistant:

__forceinline vboolf4 operator !=(const vint4& a, const vint4& b) { return _mm_cmp_epi32_mask(a,b,_MM_CMPINT_NE); }